

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::AppendToBuffer(FlowBuffer *this,const_byteptr data,int len)

{
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  int in_stack_0000003c;
  FlowBuffer *in_stack_00000040;
  
  if (0 < in_EDX) {
    ExpandBuffer(in_stack_00000040,in_stack_0000003c);
    memcpy((void *)(*(long *)(in_RDI + 0x10) + (long)*(int *)(in_RDI + 8)),in_RSI,(long)in_EDX);
    *(int *)(in_RDI + 8) = in_EDX + *(int *)(in_RDI + 8);
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + (long)in_EDX;
  }
  return;
}

Assistant:

void FlowBuffer::AppendToBuffer(const_byteptr data, int len)
	{
	if ( len <= 0 )
		return;

	BINPAC_ASSERT(! chunked_);
	ExpandBuffer(buffer_n_ + len);
	memcpy(buffer_ + buffer_n_, data, len);
	buffer_n_ += len;

	orig_data_begin_ += len;
	BINPAC_ASSERT(orig_data_begin_ <= orig_data_end_);
	}